

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

bool __thiscall
Js::JavascriptString::GetPropertyBuiltIns
          (JavascriptString *this,PropertyId propertyId,Var *value,ScriptContext *requestContext)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  double value_00;
  
  if (propertyId == 0xd1) {
    uVar1 = this->m_charLength;
    if ((long)(int)uVar1 < 0) {
      value_00 = (double)uVar1;
      uVar4 = NumberUtilities::ToSpecial(value_00);
      bVar3 = NumberUtilities::IsNan(value_00);
      if (bVar3) {
        uVar5 = NumberUtilities::ToSpecial(value_00);
        if (uVar5 != 0xfff8000000000000) {
          uVar5 = NumberUtilities::ToSpecial(value_00);
          if (uVar5 != 0x7ff8000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar6 = 0;
          }
        }
      }
      pRVar7 = (RecyclableObject *)(uVar4 ^ 0xfffc000000000000);
    }
    else {
      pRVar7 = (RecyclableObject *)((long)(int)uVar1 | 0x1000000000000);
    }
  }
  else {
    pRVar7 = ScriptContext::GetMissingPropertyResult(requestContext);
  }
  *value = pRVar7;
  return propertyId == 0xd1;
}

Assistant:

bool JavascriptString::GetPropertyBuiltIns(PropertyId propertyId, Var* value, ScriptContext* requestContext)
    {
        if (propertyId == PropertyIds::length)
        {
            *value = JavascriptNumber::ToVar(this->GetLength(), requestContext);
            return true;
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }